

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O0

void __thiscall
dgrminer::PartialUnion::removeInfrequentEdges
          (PartialUnion *this,
          vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *newedges,
          set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
          *edges_set,int support_as_absolute,bool set_of_graphs,bool debugPrint)

{
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  *this_00;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *__cont;
  __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  local_128;
  const_iterator local_120;
  anon_class_64_4_590a51ff_for__M_pred local_118;
  __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  local_d8;
  __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  local_d0;
  __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  local_c8;
  const_iterator local_c0;
  array<int,_8UL> *local_b8;
  __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  local_b0;
  const_iterator local_a8;
  anon_class_64_6_c25d18ae_for__M_pred local_90;
  __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  local_50;
  __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  local_48;
  __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  local_40;
  const_iterator local_38;
  int local_2c;
  undefined1 local_26;
  byte local_25;
  int count;
  bool debugPrint_local;
  bool set_of_graphs_local;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  *psStack_20;
  int support_as_absolute_local;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  *edges_set_local;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *newedges_local;
  PartialUnion *this_local;
  
  local_2c = 0;
  __cont = &this->edges;
  local_26 = debugPrint;
  local_25 = set_of_graphs;
  count = support_as_absolute;
  psStack_20 = edges_set;
  edges_set_local =
       (set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
        *)newedges;
  newedges_local = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)this;
  local_48._M_current =
       (array<int,_8UL> *)
       std::begin<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>(__cont);
  local_50._M_current =
       (array<int,_8UL> *)
       std::end<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>(__cont);
  local_90.edges_set = psStack_20;
  local_90.support_as_absolute = count;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_90.newedges,
             (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)edges_set_local
            );
  local_90.count = &local_2c;
  local_90.set_of_graphs = (bool)(local_25 & 1);
  local_90.this = this;
  local_40 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::array<int,8ul>*,std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>,dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                       (local_48,local_50,&local_90);
  __gnu_cxx::
  __normal_iterator<std::array<int,8ul>const*,std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>
  ::__normal_iterator<std::array<int,8ul>*>
            ((__normal_iterator<std::array<int,8ul>const*,std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>
              *)&local_38,&local_40);
  local_b0._M_current =
       (array<int,_8UL> *)
       std::end<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>(&this->edges);
  __gnu_cxx::
  __normal_iterator<std::array<int,8ul>const*,std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>
  ::__normal_iterator<std::array<int,8ul>*>
            ((__normal_iterator<std::array<int,8ul>const*,std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>
              *)&local_a8,&local_b0);
  local_b8 = (array<int,_8UL> *)
             std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::erase
                       (__cont,local_38,local_a8);
  removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)
  ::$_0::~__0((__0 *)&local_90);
  this_00 = edges_set_local;
  local_d0._M_current =
       (array<int,_8UL> *)
       std::begin<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>
                 ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                  edges_set_local);
  local_d8._M_current =
       (array<int,_8UL> *)
       std::end<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>
                 ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                  edges_set_local);
  std::
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::set(&local_118.edges_set,psStack_20);
  local_118.support_as_absolute = count;
  local_118.set_of_graphs = (bool)(local_25 & 1);
  local_118.this = this;
  local_c8 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::array<int,8ul>*,std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>,dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                       (local_d0,local_d8,&local_118);
  __gnu_cxx::
  __normal_iterator<std::array<int,8ul>const*,std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>
  ::__normal_iterator<std::array<int,8ul>*>
            ((__normal_iterator<std::array<int,8ul>const*,std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>
              *)&local_c0,&local_c8);
  local_128._M_current =
       (array<int,_8UL> *)
       std::end<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>
                 ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                  edges_set_local);
  __gnu_cxx::
  __normal_iterator<std::array<int,8ul>const*,std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>
  ::__normal_iterator<std::array<int,8ul>*>
            ((__normal_iterator<std::array<int,8ul>const*,std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>
              *)&local_120,&local_128);
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::erase
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)this_00,
             local_c0,local_120);
  removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)
  ::$_1::~__1((__1 *)&local_118);
  return;
}

Assistant:

void PartialUnion::removeInfrequentEdges(std::vector<std::array<int, 8>> & newedges, std::set<labeled_edge_with_occurrences> & edges_set,
		int support_as_absolute, bool set_of_graphs, bool debugPrint = false)
	{
		int count = 0;
		edges.erase(std::remove_if(std::begin(edges), std::end(edges), [&edges_set, support_as_absolute, newedges, &count, set_of_graphs, this](array<int, 8> edge) mutable {
			std::array<int, 8> ne = newedges[count];
			labeled_edge_with_occurrences le;
			le.elements = smallerDirectionOfAdjacencyInfo(ne);
			++count;

		  	std::set<labeled_edge_with_occurrences>::iterator it = edges_set.find(le);

			if (set_of_graphs)
			{
				std::set<int> mapped_occurrences;
				std::set<int>::iterator it2;
				for (it2 = it->occurrences.begin(); it2 != it->occurrences.end(); ++it2)
				{
					mapped_occurrences.insert(queryMappingSnapshotsToGraphs(*it2));
				}

				return (((!new_measures && mapped_occurrences.size() < support_as_absolute) || (new_measures && it->support(edges, true, heuristic_mis) < support_as_absolute))
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}
			else
			{
				// only change edges can be infrequent (i.e. any of their changetimes >= 0)
				return (it->support(edges, new_measures, heuristic_mis) < support_as_absolute
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}

		}), std::end(edges));


		newedges.erase(std::remove_if(std::begin(newedges), std::end(newedges), [edges_set, support_as_absolute, set_of_graphs, this](array<int, 8> edge) {
			labeled_edge_with_occurrences le;
			le.elements = smallerDirectionOfAdjacencyInfo(edge);

			auto it = edges_set.find(le);

			if (set_of_graphs)
			{
				std::set<int> mapped_occurrences;
				std::set<int>::iterator it2;
				for (it2 = it->occurrences.begin(); it2 != it->occurrences.end(); ++it2)
				{
					mapped_occurrences.insert(queryMappingSnapshotsToGraphs(*it2));
				}
				return (((!new_measures && mapped_occurrences.size() < support_as_absolute) || (new_measures && it->support(edges, true, heuristic_mis) < support_as_absolute))
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}
			else
			{
				return (it->support(edges, new_measures, heuristic_mis) < support_as_absolute
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}

		}), std::end(newedges));
	}